

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

BasicBlock * __thiscall spvtools::opt::Loop::GetOrCreatePreHeaderBlock(Loop *this)

{
  IRContext *this_00;
  BasicBlock *pBVar1;
  
  if (this->loop_preheader_ != (BasicBlock *)0x0) {
    return this->loop_preheader_;
  }
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_00);
  }
  pBVar1 = CFG::SplitLoopHeader
                     ((this_00->cfg_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                      .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,
                      this->loop_header_);
  this->loop_header_ = pBVar1;
  return this->loop_preheader_;
}

Assistant:

BasicBlock* Loop::GetOrCreatePreHeaderBlock() {
  if (loop_preheader_) return loop_preheader_;

  CFG* cfg = context_->cfg();
  loop_header_ = cfg->SplitLoopHeader(loop_header_);
  return loop_preheader_;
}